

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs)

{
  byte bVar1;
  ushort uVar2;
  IRIns *pIVar3;
  char cVar4;
  Reg dest;
  uint uVar5;
  MCode *pMVar6;
  uint uVar7;
  uint uVar8;
  
  uVar2 = (ir->field_0).op2;
  pIVar3 = as->ir;
  cVar4 = (char)xs;
  if ((short)uVar2 < 0) {
    dest = ra_dest(as,ir,0xffed);
    if (dest == 1) {
      dest = ra_scratch(as,0xffed);
      pMVar6 = as->mcp;
      pMVar6[-1] = (byte)dest & 7 | 200;
      pMVar6[-2] = 0x8b;
      if ((dest & 8) == 0) {
        pMVar6 = pMVar6 + -2;
      }
      else {
        pMVar6[-3] = 'A';
        pMVar6 = pMVar6 + -3;
      }
      as->mcp = pMVar6;
    }
    bVar1 = *(byte *)((long)pIVar3 + (ulong)uVar2 * 8 + 6);
    if ((char)bVar1 < '\0') {
      uVar5 = ra_allocref(as,(uint)uVar2,2);
    }
    else {
      uVar5 = 1;
      if (bVar1 != 1) {
        ra_scratch(as,2);
        uVar5 = (uint)bVar1;
      }
    }
    uVar7._0_2_ = *(IROpT *)((long)ir + 4);
    uVar7._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar7 = (-(uint)((0x604208U >> (uVar7 & 0x1f) & 1) != 0) & 0x80200) + xs;
    pMVar6 = as->mcp;
    pMVar6[-1] = ((byte)dest & 7) + cVar4 * '\b' | 0xc0;
    pMVar6[-2] = 0xd3;
    uVar8 = dest >> 3 & 1 | uVar7 >> 1 & 0x104;
    if (uVar8 == 0) {
      pMVar6 = pMVar6 + -2;
    }
    else {
      pMVar6[-3] = (byte)uVar8 | (byte)(uVar7 >> 0x10) | 0x40;
      pMVar6 = pMVar6 + -3;
    }
    as->mcp = pMVar6;
    bVar1 = (byte)uVar5 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    if (uVar5 == 1) goto LAB_0013e31c;
    pMVar6[-1] = (byte)uVar5 & 7 | 200;
    pMVar6[-2] = 0x8b;
    if ((uVar5 & 8) == 0) goto LAB_0013e307;
    pMVar6[-3] = 'A';
    goto LAB_0013e311;
  }
  dest = ra_dest(as,ir,0xffef);
  uVar7 = 0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1;
  uVar5 = (uVar7 << 5 | 0x1f) & pIVar3[uVar2].field_1.op12;
  if (uVar5 == 0) goto LAB_0013e31c;
  if (uVar5 == 1) {
    uVar7 = (-uVar7 & 0x80200) + xs;
    pMVar6 = as->mcp;
    pMVar6[-1] = ((byte)dest & 7) + cVar4 * '\b' | 0xc0;
    pMVar6[-2] = 0xd1;
    uVar5 = dest >> 3 & 1 | uVar7 >> 1 & 0x104;
    if (uVar5 != 0) {
      pMVar6[-3] = (byte)uVar5 | (byte)(uVar7 >> 0x10) | 0x40;
      goto LAB_0013e311;
    }
LAB_0013e307:
    pMVar6 = pMVar6 + -2;
  }
  else {
    pMVar6 = as->mcp;
    as->mcp = pMVar6 + -1;
    pMVar6[-1] = (MCode)uVar5;
    uVar5._0_2_ = *(IROpT *)((long)ir + 4);
    uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar5 = (-(uint)((0x604208U >> (uVar5 & 0x1f) & 1) != 0) & 0x80200) + xs;
    pMVar6 = as->mcp;
    pMVar6[-1] = ((byte)dest & 7) + cVar4 * '\b' | 0xc0;
    pMVar6[-2] = 0xc1;
    uVar7 = dest >> 3 & 1 | uVar5 >> 1 & 0x104;
    if (uVar7 == 0) goto LAB_0013e307;
    pMVar6[-3] = (byte)uVar7 | (byte)(uVar5 >> 0x10) | 0x40;
LAB_0013e311:
    pMVar6 = pMVar6 + -3;
  }
  as->mcp = pMVar6;
LAB_0013e31c:
  ra_left(as,dest,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, RID_ECX, dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}